

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_serialize_to_buffer(JSON_Value *value,char *buf,size_t buf_size_in_bytes)

{
  int iVar1;
  int iVar2;
  char num_buf [64];
  char acStack_58 [64];
  
  iVar1 = json_serialize_to_buffer_r(value,(char *)0x0,0,0,acStack_58);
  iVar2 = -1;
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  if ((ulong)(long)iVar1 < buf_size_in_bytes) {
    iVar2 = json_serialize_to_buffer_r(value,buf,0,0,(char *)0x0);
    iVar2 = iVar2 >> 0x1f;
  }
  return iVar2;
}

Assistant:

JSON_Status json_serialize_to_buffer(const JSON_Value *value, char *buf, size_t buf_size_in_bytes) {
    int written = -1;
    size_t needed_size_in_bytes = json_serialization_size(value);
    if (needed_size_in_bytes == 0 || buf_size_in_bytes < needed_size_in_bytes) {
        return JSONFailure;
    }
    written = json_serialize_to_buffer_r(value, buf, 0, PARSON_FALSE, NULL);
    if (written < 0) {
        return JSONFailure;
    }
    return JSONSuccess;
}